

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O2

void __thiscall ODDLParser::DDLNode::detachParent(DDLNode *this)

{
  DDLNode *pDVar1;
  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
  __position;
  
  pDVar1 = this->m_parent;
  if (pDVar1 != (DDLNode *)0x0) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<ODDLParser::DDLNode**,std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<ODDLParser::DDLNode*const>>
                           ((pDVar1->m_children).
                            super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (pDVar1->m_children).
                            super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    if ((this->m_parent->m_children).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish != __position._M_current) {
      std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::erase
                (&this->m_parent->m_children,(const_iterator)__position._M_current);
    }
    this->m_parent = (DDLNode *)0x0;
  }
  return;
}

Assistant:

void DDLNode::detachParent() {
    if( ddl_nullptr != m_parent ) {
        DDLNodeIt it = std::find( m_parent->m_children.begin(), m_parent->m_children.end(), this );
        if( m_parent->m_children.end() != it ) {
            m_parent->m_children.erase( it );
        }
        m_parent = ddl_nullptr;
    }
}